

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

void cfd::api::json::DecodeRawTransactionRequest::CollectFieldName(void)

{
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> func_table;
  allocator local_f9;
  undefined1 local_f8 [48];
  code *local_c8;
  code *local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (json_mapper_abi_cxx11_._40_8_ == 0) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_f8._8_8_ = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_f8._0_8_ = GetHexString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionRequest_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionRequest_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionRequest_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionRequest_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetHexString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_b8 = GetHexFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>
    ::
    _M_emplace_unique<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>
                *)json_mapper_abi_cxx11_,(char (*) [4])0x48aab0,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"hex",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetNetworkString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionRequest_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionRequest_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionRequest_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionRequest_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetNetworkString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetNetworkFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>
    ::
    _M_emplace_unique<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>
                *)json_mapper_abi_cxx11_,(char (*) [8])0x4a3173,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"network",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetIswitnessString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionRequest_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionRequest_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionRequest_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionRequest_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetIswitnessString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionRequest_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetIswitnessFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>
    ::
    _M_emplace_unique<char_const(&)[10],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>>>>
                *)json_mapper_abi_cxx11_,(char (*) [10])"iswitness",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"iswitness",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionRequest> *)&local_98);
  }
  return;
}

Assistant:

XpubDataStruct XpubData::ConvertToStruct() const {  // NOLINT
  XpubDataStruct result;
  result.base58 = base58_;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}